

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_getcwd(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int rc;
  jx9_vfs *pVfs;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pvVar2 = jx9_context_user_data(pCtx);
  if ((pvVar2 == (void *)0x0) || (*(long *)((long)pvVar2 + 0x20) == 0)) {
    pcVar3 = jx9_function_name(pCtx);
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
               ,pcVar3);
    jx9_result_bool(pCtx,0);
  }
  else {
    jx9_result_string(pCtx,"",0);
    iVar1 = (**(code **)((long)pvVar2 + 0x20))(pCtx);
    if (iVar1 != 0) {
      jx9_result_bool(pCtx,0);
    }
  }
  return 0;
}

Assistant:

static int jx9Vfs_getcwd(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	int rc;
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xGetcwd == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	jx9_result_string(pCtx, "", 0);
	/* Perform the requested operation */
	rc = pVfs->xGetcwd(pCtx);
	if( rc != JX9_OK ){
		/* Error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}